

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

field_t * __thiscall cfgfile::generator::cfg::tag_base_class_t::cfg(tag_base_class_t *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  field_type_t t;
  pos_t pVar5;
  tag_t<cfgfile::string_trait_t> *this_00;
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  *in_RSI;
  field_t *in_RDI;
  tag_class_t *c;
  field_t *f;
  string *in_stack_fffffffffffffef8;
  undefined6 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  tag_t<cfgfile::string_trait_t> *in_stack_ffffffffffffff18;
  tag_t<cfgfile::string_trait_t> *this_01;
  undefined6 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff68;
  field_t *this_02;
  
  this_02 = in_RDI;
  field_t::field_t((field_t *)
                   CONCAT17(in_stack_ffffffffffffff07,
                            CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
  field_t::set_base(this_02,true);
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ::value(in_RSI);
  t = field_type_from_string(in_stack_fffffffffffffef8);
  field_t::set_type(this_02,t);
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ::value((tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
           *)&in_RSI[2].super_tag_t<cfgfile::string_trait_t>.m_child_tags.
              super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  field_t::set_name((field_t *)
                    CONCAT17(in_stack_ffffffffffffff07,
                             CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
                    in_stack_fffffffffffffef8);
  pVar5 = tag_t<cfgfile::string_trait_t>::line_number(&in_RSI->super_tag_t<cfgfile::string_trait_t>)
  ;
  field_t::set_line_number(this_02,pVar5);
  pVar5 = tag_t<cfgfile::string_trait_t>::column_number
                    (&in_RSI->super_tag_t<cfgfile::string_trait_t>);
  field_t::set_column_number(this_02,pVar5);
  bVar1 = tag_t<cfgfile::string_trait_t>::is_defined(in_stack_ffffffffffffff18);
  if (bVar1) {
    tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
    ::value(in_RSI + 1);
    field_t::set_value_type
              ((field_t *)
               CONCAT17(in_stack_ffffffffffffff07,
                        CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
               in_stack_fffffffffffffef8);
  }
  uVar2 = tag_t<cfgfile::string_trait_t>::is_defined(in_stack_ffffffffffffff18);
  if ((bool)uVar2) {
    field_t::set_required(this_02,true);
  }
  uVar3 = tag_t<cfgfile::string_trait_t>::is_defined(in_stack_ffffffffffffff18);
  if ((bool)uVar3) {
    tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
    ::value((tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
             *)&in_RSI[7].field_0x68);
    field_t::set_default_value
              ((field_t *)
               CONCAT17(in_stack_ffffffffffffff07,
                        CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
               in_stack_fffffffffffffef8);
  }
  this_00 = tag_t<cfgfile::string_trait_t>::parent(&in_RSI->super_tag_t<cfgfile::string_trait_t>);
  this_01 = (tag_t<cfgfile::string_trait_t> *)
            &in_RSI[6].super_tag_t<cfgfile::string_trait_t>.field_0x10;
  tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(this_00);
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ::value((tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
           *)&in_RSI[2].super_tag_t<cfgfile::string_trait_t>.m_child_tags.
              super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  check_constraints(&in_RSI->super_tag_t<cfgfile::string_trait_t>,
                    (tag_t<cfgfile::string_trait_t> *)this_02,(string *)in_RDI,
                    (string *)CONCAT44(t,in_stack_ffffffffffffff68));
  uVar4 = tag_t<cfgfile::string_trait_t>::is_defined(this_01);
  if ((bool)uVar4) {
    tag_min_max_constraint_t::cfg
              ((tag_min_max_constraint_t *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_ffffffffffffff38))
              );
    std::shared_ptr<cfgfile::generator::cfg::constraint_base_t>::
    shared_ptr<cfgfile::generator::cfg::min_max_constraint_t,void>
              ((shared_ptr<cfgfile::generator::cfg::constraint_base_t> *)
               CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
               (shared_ptr<cfgfile::generator::cfg::min_max_constraint_t> *)
               in_stack_fffffffffffffef8);
    field_t::set_constraint
              ((field_t *)
               CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)),
               (shared_ptr<cfgfile::generator::cfg::constraint_base_t> *)in_stack_fffffffffffffef8);
    std::shared_ptr<cfgfile::generator::cfg::constraint_base_t>::~shared_ptr
              ((shared_ptr<cfgfile::generator::cfg::constraint_base_t> *)0x10db08);
    std::shared_ptr<cfgfile::generator::cfg::min_max_constraint_t>::~shared_ptr
              ((shared_ptr<cfgfile::generator::cfg::min_max_constraint_t> *)0x10db15);
  }
  else {
    uVar2 = tag_t<cfgfile::string_trait_t>::is_defined(this_01);
    if ((bool)uVar2) {
      tag_one_of_constraint_t::cfg((tag_one_of_constraint_t *)this_00);
      std::shared_ptr<cfgfile::generator::cfg::constraint_base_t>::
      shared_ptr<cfgfile::generator::cfg::one_of_constraint_t,void>
                ((shared_ptr<cfgfile::generator::cfg::constraint_base_t> *)
                 CONCAT17(uVar4,CONCAT16(uVar2,in_stack_ffffffffffffff00)),
                 (shared_ptr<cfgfile::generator::cfg::one_of_constraint_t> *)
                 in_stack_fffffffffffffef8);
      field_t::set_constraint
                ((field_t *)CONCAT17(uVar4,CONCAT16(uVar2,in_stack_ffffffffffffff00)),
                 (shared_ptr<cfgfile::generator::cfg::constraint_base_t> *)in_stack_fffffffffffffef8
                );
      std::shared_ptr<cfgfile::generator::cfg::constraint_base_t>::~shared_ptr
                ((shared_ptr<cfgfile::generator::cfg::constraint_base_t> *)0x10db93);
      std::shared_ptr<cfgfile::generator::cfg::one_of_constraint_t>::~shared_ptr
                ((shared_ptr<cfgfile::generator::cfg::one_of_constraint_t> *)0x10dba0);
    }
  }
  return in_RDI;
}

Assistant:

field_t
tag_base_class_t::cfg() const
{
	field_t f;
	f.set_base( true );
	f.set_type( field_type_from_string( value() ) );
	f.set_name( m_name.value() );
	f.set_line_number( line_number() );
	f.set_column_number( column_number() );

	if( m_value_type.is_defined() )
		f.set_value_type( m_value_type.value() );

	if( m_is_required.is_defined() )
		f.set_required();

	if( m_default_value.is_defined() )
		f.set_default_value( m_default_value.value() );

	const tag_class_t * c = static_cast< const tag_class_t* > ( parent() );

	check_constraints( m_min_max_constraint, m_one_of_constraint,
		c->name(), m_name.value() );

	if( m_min_max_constraint.is_defined() )
		f.set_constraint( m_min_max_constraint.cfg() );
	else if( m_one_of_constraint.is_defined() )
		f.set_constraint( m_one_of_constraint.cfg() );

	return f;
}